

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlHashedString xmlParseQNameHashed(xmlParserCtxtPtr ctxt,xmlHashedString *prefix)

{
  xmlParserCtxtPtr pxVar1;
  bool bVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlHashedString xVar5;
  xmlChar *tmp;
  undefined4 uStack_4c;
  int isNCName;
  int start;
  xmlHashedString p;
  xmlHashedString *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  xmlHashedString l;
  
  bVar2 = false;
  p.hashValue = 0;
  p._4_4_ = 0;
  if (((ctxt->input->flags & 0x40U) == 0) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  iVar3 = (int)ctxt->input->cur - (int)ctxt->input->base;
  xVar5 = xmlParseNCName(ctxt);
  pxVar4 = xVar5.name;
  pxVar1 = (xmlParserCtxtPtr)CONCAT44(uStack_4c,xVar5.hashValue);
  ctxt_local = pxVar1;
  l._0_8_ = pxVar4;
  if ((pxVar4 != (xmlChar *)0x0) && (bVar2 = true, *ctxt->input->cur == ':')) {
    xmlNextChar(ctxt);
    xVar5 = xmlParseNCName(ctxt);
    l._0_8_ = xVar5.name;
    ctxt_local = (xmlParserCtxtPtr)(ulong)xVar5.hashValue;
    _isNCName = pxVar1;
    p._0_8_ = pxVar4;
  }
  if ((l._0_8_ == 0) || (*ctxt->input->cur == ':')) {
    l.hashValue = 0;
    l._4_4_ = 0;
    p.hashValue = 0;
    p._4_4_ = 0;
    if ((!bVar2) && (*ctxt->input->cur != ':')) goto LAB_001556e7;
    pxVar4 = xmlParseNmtoken(ctxt);
    if (pxVar4 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar4);
    }
    xVar5 = xmlDictLookupHashed(ctxt->dict,ctxt->input->base + iVar3,
                                (int)ctxt->input->cur - ((int)ctxt->input->base + iVar3));
    l._0_8_ = xVar5.name;
    ctxt_local = (xmlParserCtxtPtr)(ulong)xVar5.hashValue;
    if ((xmlChar *)l._0_8_ == (xmlChar *)0x0) {
      xmlErrMemory(ctxt);
      goto LAB_001556e7;
    }
    xmlNsErr(ctxt,XML_NS_ERR_QNAME,"Failed to parse QName \'%s\'\n",(xmlChar *)l._0_8_,
             (xmlChar *)0x0,(xmlChar *)0x0);
  }
  *(xmlParserCtxtPtr *)prefix = _isNCName;
  prefix->name = (xmlChar *)p._0_8_;
LAB_001556e7:
  xVar5._0_8_ = (ulong)ctxt_local & 0xffffffff;
  xVar5.name = (xmlChar *)l._0_8_;
  return xVar5;
}

Assistant:

static xmlHashedString
xmlParseQNameHashed(xmlParserCtxtPtr ctxt, xmlHashedString *prefix) {
    xmlHashedString l, p;
    int start, isNCName = 0;

    l.name = NULL;
    p.name = NULL;

    GROW;
    start = CUR_PTR - BASE_PTR;

    l = xmlParseNCName(ctxt);
    if (l.name != NULL) {
        isNCName = 1;
        if (CUR == ':') {
            NEXT;
            p = l;
            l = xmlParseNCName(ctxt);
        }
    }
    if ((l.name == NULL) || (CUR == ':')) {
        xmlChar *tmp;

        l.name = NULL;
        p.name = NULL;
        if ((isNCName == 0) && (CUR != ':'))
            return(l);
        tmp = xmlParseNmtoken(ctxt);
        if (tmp != NULL)
            xmlFree(tmp);
        l = xmlDictLookupHashed(ctxt->dict, BASE_PTR + start,
                                CUR_PTR - (BASE_PTR + start));
        if (l.name == NULL) {
            xmlErrMemory(ctxt);
            return(l);
        }
        xmlNsErr(ctxt, XML_NS_ERR_QNAME,
                 "Failed to parse QName '%s'\n", l.name, NULL, NULL);
    }

    *prefix = p;
    return(l);
}